

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

void handle_error(SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance)

{
  IO_STATE IVar1;
  int iVar2;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance_local;
  
  IVar1 = sasl_client_io_instance->io_state;
  if (IVar1 != IO_STATE_NOT_OPEN) {
    if (IVar1 - IO_STATE_OPENING_UNDERLYING_IO < 2) {
      iVar2 = xio_close(sasl_client_io_instance->underlying_io,on_underlying_io_close_complete,
                        sasl_client_io_instance);
      if (iVar2 != 0) {
        sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
        indicate_open_complete(sasl_client_io_instance,IO_OPEN_ERROR);
      }
    }
    else if (IVar1 == IO_STATE_OPEN) {
      sasl_client_io_instance->io_state = IO_STATE_ERROR;
      indicate_error(sasl_client_io_instance);
    }
  }
  return;
}

Assistant:

static void handle_error(SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance)
{
    switch (sasl_client_io_instance->io_state)
    {
    default:
    case IO_STATE_NOT_OPEN:
        break;

    case IO_STATE_OPENING_UNDERLYING_IO:
    case IO_STATE_SASL_HANDSHAKE:
        if (xio_close(sasl_client_io_instance->underlying_io, on_underlying_io_close_complete, sasl_client_io_instance) != 0)
        {
            sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
            indicate_open_complete(sasl_client_io_instance, IO_OPEN_ERROR);
        }
        break;

    case IO_STATE_OPEN:
        sasl_client_io_instance->io_state = IO_STATE_ERROR;
        indicate_error(sasl_client_io_instance);
        break;
    }
}